

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h1-proxy.c
# Opt level: O2

CURLcode cf_h1_proxy_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  Curl_handler *pCVar1;
  ulong uVar2;
  long lVar3;
  dynbuf *pdVar4;
  Curl_chunker *ch;
  _Bool _Var5;
  CURLcode CVar6;
  int iVar7;
  undefined4 uVar8;
  uint uVar9;
  h1_tunnel_state_conflict *ts;
  timediff_t tVar10;
  size_t size;
  char *pcVar11;
  size_t sVar12;
  char *auth;
  h1_tunnel_state_conflict *ts_00;
  Curl_easy *data_00;
  bool bVar13;
  _Bool local_96;
  char byte;
  CURLcode local_94;
  ssize_t nread;
  h1_tunnel_state_conflict *local_88;
  char *local_80;
  size_t *local_78;
  connectdata *local_70;
  dynbuf *local_68;
  undefined4 local_60;
  curl_socket_t local_5c;
  Curl_chunker *local_58;
  _Bool *local_50;
  dynbuf *local_48;
  curl_off_t *local_40;
  size_t local_38;
  
  if ((cf->field_0x24 & 1) != 0) {
    *done = true;
    return CURLE_OK;
  }
  ts = (h1_tunnel_state_conflict *)cf->ctx;
  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
     (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"connect");
  }
  CVar6 = (*cf->next->cft->do_connect)(cf->next,data,blocking,done);
  if (CVar6 != CURLE_OK) {
    return CVar6;
  }
  if (*done != true) {
    return CURLE_OK;
  }
  *done = false;
  if (ts == (h1_tunnel_state_conflict *)0x0) {
    pCVar1 = cf->conn->handler;
    if ((pCVar1->flags & 0x4000) != 0) {
      Curl_failf(data,"%s cannot be done over CONNECT",pCVar1->scheme);
      return CURLE_UNSUPPORTED_PROTOCOL;
    }
    CVar6 = Curl_get_upload_buffer(data);
    if (CVar6 != CURLE_OK) {
      return CVar6;
    }
    ts = (h1_tunnel_state_conflict *)(*Curl_ccalloc)(1,0x120);
    if (ts == (h1_tunnel_state_conflict *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
      Curl_infof(data,"allocate connect buffer");
    }
    Curl_dyn_init(&ts->rcvbuf,0x4000);
    Curl_dyn_init(&ts->request_data,0x100000);
    Curl_httpchunk_init(data,&ts->ch,true);
    data_00 = (Curl_easy *)0x0;
    Curl_conncontrol(cf->conn,0);
    tunnel_reinit((Curl_cfilter *)ts,data_00,ts_00);
    cf->ctx = ts;
  }
  local_88 = ts;
  if (ts->tunnel_state == H1_TUNNEL_ESTABLISHED) goto LAB_00583b6c;
  if (ts->tunnel_state != H1_TUNNEL_FAILED) {
    local_70 = cf->conn;
    local_48 = &ts->request_data;
    local_78 = &ts->nsent;
    local_68 = &ts->rcvbuf;
    local_40 = &ts->cl;
    local_58 = &ts->ch;
    local_50 = done;
LAB_0058311d:
    tVar10 = Curl_timeleft(data,(curltime *)0x0,true);
    if (tVar10 < 1) {
      Curl_failf(data,"Proxy CONNECT aborted due to timeout");
      CVar6 = CURLE_OPERATION_TIMEDOUT;
      goto LAB_00583c64;
    }
    switch(ts->tunnel_state) {
    case H1_TUNNEL_INIT:
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
         (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"CONNECT start");
      }
      nread = 0;
      (*Curl_cfree)((data->req).newurl);
      (data->req).newurl = (char *)0x0;
      CVar6 = Curl_http_proxy_create_CONNECT((httpreq **)&nread,cf,data,1);
      if (CVar6 == CURLE_OK) {
        if (((data->set).field_0x8bd & 0x10) != 0) {
          Curl_infof(data,"Establish HTTP proxy tunnel to %s",*(undefined8 *)(nread + 0x20));
        }
        pdVar4 = local_48;
        Curl_dyn_reset(local_48);
        *local_78 = 0;
        local_78[1] = 0;
        CVar6 = Curl_h1_req_write_head
                          ((httpreq *)nread,(uint)((cf->conn->http_proxy).proxytype != '\x01'),
                           pdVar4);
        if (CVar6 != CURLE_OK) goto LAB_00583215;
        CVar6 = CURLE_OK;
      }
      else {
LAB_00583215:
        Curl_failf(data,"Failed sending CONNECT to proxy");
      }
      if (nread != 0) {
        Curl_http_req_free((httpreq *)nread);
      }
      if (CVar6 != CURLE_OK) goto LAB_00583c64;
      h1_tunnel_go_state(cf,local_88,H1_TUNNEL_CONNECT,data);
LAB_0058325f:
      if ((((data->set).field_0x8bd & 0x10) != 0) && (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"CONNECT send");
      }
      break;
    case H1_TUNNEL_CONNECT:
      if (data != (Curl_easy *)0x0) goto LAB_0058325f;
      break;
    case H1_TUNNEL_RECEIVE:
      goto switchD_00583152_caseD_2;
    case H1_TUNNEL_RESPONSE:
      goto switchD_00583152_caseD_3;
    default:
      goto switchD_00583152_default;
    }
    pdVar4 = local_48;
    pcVar11 = Curl_dyn_ptr(local_48);
    sVar12 = Curl_dyn_len(pdVar4);
    nread = nread & 0xffffffff00000000;
    uVar2 = *local_78;
    if (uVar2 <= sVar12 && sVar12 - uVar2 != 0) {
      size = (*cf->next->cft->do_send)
                       (cf->next,data,pcVar11 + uVar2,sVar12 - uVar2,(CURLcode *)&nread);
      if ((long)size < 0) {
        if ((CURLcode)nread == 0x51) goto LAB_0058331b;
      }
      else {
        *local_78 = *local_78 + size;
        Curl_debug(data,CURLINFO_HEADER_OUT,pcVar11 + uVar2,size);
      }
      if ((CURLcode)nread != 0) {
        Curl_failf(data,"Failed sending CONNECT to proxy");
        if ((CURLcode)nread != CURLE_OK) {
          local_96 = false;
          CVar6 = (CURLcode)nread;
          goto LAB_00583c64;
        }
      }
    }
LAB_0058331b:
    ts = local_88;
    if (sVar12 <= *local_78) {
      h1_tunnel_go_state(cf,local_88,H1_TUNNEL_RECEIVE,data);
switchD_00583152_caseD_2:
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
         (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"CONNECT receive");
      }
      local_5c = Curl_conn_cf_get_socket(cf,data);
      local_96 = false;
      _Var5 = Curl_conn_data_pending(data,cf->sockindex);
      local_94 = CURLE_OK;
      CVar6 = local_94;
      if (_Var5) {
LAB_0058339a:
        if (ts->keepon == KEEPON_DONE) goto LAB_00583954;
        CVar6 = Curl_read(data,local_5c,&byte,1,&nread);
        if (CVar6 == CURLE_AGAIN) {
          local_94 = CURLE_OK;
          CVar6 = local_94;
          goto LAB_005839c1;
        }
        iVar7 = Curl_pgrsUpdate(data);
        ch = local_58;
        if (iVar7 != 0) {
          CVar6 = CURLE_ABORTED_BY_CALLBACK;
          goto LAB_005839c1;
        }
        if (CVar6 != CURLE_OK) {
          ts->keepon = KEEPON_DONE;
          local_96 = true;
          bVar13 = true;
          local_94 = CVar6;
          goto LAB_005839c4;
        }
        if (nread < 1) {
          if ((((data->set).proxyauth == 0) || ((data->state).authproxy.avail == 0)) ||
             ((data->state).aptr.proxyuserpwd == (char *)0x0)) {
            Curl_failf(data,"Proxy CONNECT aborted");
            ts->keepon = KEEPON_DONE;
            local_96 = true;
            local_94 = CURLE_RECV_ERROR;
            goto LAB_0058399c;
          }
          ts->field_0x11c = ts->field_0x11c | 2;
          if (((data->set).field_0x8bd & 0x10) != 0) {
            Curl_infof(data,"Proxy CONNECT connection closed");
          }
          goto LAB_0058394c;
        }
        if (ts->keepon == KEEPON_IGNORE) {
          lVar3 = *local_40;
          if (lVar3 != 0) {
            *local_40 = lVar3 + -1;
            if (lVar3 < 2) goto LAB_0058394c;
            goto LAB_0058339a;
          }
          if ((ts->field_0x11c & 1) == 0) goto LAB_0058339a;
          local_38 = 0;
          CVar6 = Curl_httpchunk_read(data,local_58,&byte,1,&local_38);
          if (CVar6 != CURLE_OK) goto LAB_005839c1;
          _Var5 = Curl_httpchunk_is_done(data,ch);
          if (!_Var5) goto LAB_0058339a;
          if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
            Curl_infof(data,"chunk reading DONE");
          }
        }
        else {
          CVar6 = Curl_dyn_addn(local_68,&byte,1);
          pdVar4 = local_68;
          if (CVar6 != CURLE_OK) {
            Curl_failf(data,"CONNECT response too large");
            CVar6 = CURLE_RECV_ERROR;
            goto LAB_005839c1;
          }
          if (byte != '\n') goto LAB_0058339a;
          ts->headerlines = ts->headerlines + 1;
          pcVar11 = Curl_dyn_ptr(local_68);
          sVar12 = Curl_dyn_len(pdVar4);
          Curl_debug(data,CURLINFO_HEADER_IN,pcVar11,sVar12);
          CVar6 = Curl_client_write(data,(uint)((undefined1 *)ts->headerlines == &DAT_00000001) * 8
                                         + 0x14,pcVar11,sVar12);
          done = local_50;
          if ((CVar6 != CURLE_OK) ||
             (CVar6 = Curl_bump_headersize(data,sVar12,true), done = local_50, ts = local_88,
             CVar6 != CURLE_OK)) goto LAB_005839c1;
          local_80 = pcVar11;
          if ((*pcVar11 != '\r') && (*pcVar11 != '\n')) {
            iVar7 = curl_strnequal(pcVar11,"WWW-Authenticate:",0x11);
            ts = local_88;
            if ((iVar7 == 0) || ((data->req).httpcode != 0x191)) {
              iVar7 = curl_strnequal(local_80,"Proxy-authenticate:",0x13);
              pcVar11 = local_80;
              if ((iVar7 != 0) &&
                 (uVar8 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar7 >> 8),1),
                 (data->req).httpcode == 0x197)) goto LAB_00583606;
              iVar7 = curl_strnequal(local_80,"Content-Length:",0xf);
              if (iVar7 == 0) {
                _Var5 = Curl_compareheader(pcVar11,"Connection:",0xb,"close",5);
                if (_Var5) {
LAB_00583735:
                  ts->field_0x11c = ts->field_0x11c | 2;
                }
                else {
                  iVar7 = curl_strnequal(pcVar11,"Transfer-Encoding:",0x12);
                  if (iVar7 == 0) {
                    _Var5 = Curl_compareheader(pcVar11,"Proxy-Connection:",0x11,"close",5);
                    if (_Var5) goto LAB_00583735;
                    iVar7 = strncmp(pcVar11,"HTTP/1.",7);
                    if (((((iVar7 == 0) && ((pcVar11[7] & 0xfeU) == 0x30)) && (pcVar11[8] == ' '))
                        && (((byte)(pcVar11[9] - 0x30U) < 10 && ((byte)(pcVar11[10] - 0x30U) < 10)))
                        ) && (((byte)(pcVar11[0xb] - 0x30U) < 10 &&
                              (9 < (byte)(pcVar11[0xc] - 0x30U))))) {
                      iVar7 = (uint)(byte)pcVar11[0xb] +
                              (uint)(byte)pcVar11[10] * 10 + (uint)(byte)pcVar11[9] * 100 + -0x14d0;
                      (data->req).httpcode = iVar7;
                      (data->info).httpproxycode = iVar7;
                    }
                  }
                  else if ((data->req).httpcode - 200U < 100) {
                    if (((data->set).field_0x8bd & 0x10) != 0) {
                      pcVar11 = "Ignoring Transfer-Encoding in CONNECT %03d response";
                      goto LAB_005836c3;
                    }
                  }
                  else {
                    _Var5 = Curl_compareheader(pcVar11,"Transfer-Encoding:",0x12,"chunked",7);
                    if (_Var5) {
                      if (((data->set).field_0x8bd & 0x10) != 0) {
                        Curl_infof(data,"CONNECT responded chunked");
                      }
                      ts->field_0x11c = ts->field_0x11c | 1;
                      Curl_httpchunk_reset(data,local_58,true);
                    }
                  }
                }
              }
              else if ((data->req).httpcode - 200U < 100) {
                if (((data->set).field_0x8bd & 0x10) != 0) {
                  pcVar11 = "Ignoring Content-Length in CONNECT %03d response";
LAB_005836c3:
                  Curl_infof(data,pcVar11);
                }
              }
              else {
                curlx_strtoofft(local_80 + 0xf,(char **)0x0,10,local_40);
              }
            }
            else {
              uVar8 = 0;
LAB_00583606:
              pcVar11 = local_80;
              local_60 = uVar8;
              auth = Curl_copy_header_value(local_80);
              if (auth == (char *)0x0) {
                CVar6 = CURLE_OUT_OF_MEMORY;
                goto LAB_005839c1;
              }
              if ((((data->set).field_0x8bd & 0x10) != 0) && (0 < cf->cft->log_level)) {
                Curl_trc_cf_infof(data,cf,"CONNECT: fwd auth header \'%s\'",pcVar11);
              }
              CVar6 = Curl_http_input_auth(data,local_60._0_1_,auth);
              (*Curl_cfree)(auth);
              ts = local_88;
              if (CVar6 != CURLE_OK) goto LAB_005839c1;
            }
            Curl_dyn_reset(local_68);
            goto LAB_0058339a;
          }
          if (((data->req).httpcode == 0x197) && (((data->state).field_0x74c & 0x20) == 0)) {
            local_88->keepon = KEEPON_IGNORE;
            if (local_88->cl == 0) {
              uVar9 = (uint)*(undefined8 *)&(data->set).field_0x8ba;
              if ((local_88->field_0x11c & 1) == 0) {
                if (((uVar9 >> 0x1c & 1) != 0) && (0 < cf->cft->log_level)) {
                  Curl_trc_cf_infof(data,cf,"CONNECT: no content-length or chunked");
                }
                goto LAB_00583707;
              }
              if ((uVar9 >> 0x1c & 1) != 0) {
                Curl_infof(data,"Ignore chunked response-body");
              }
            }
            else if (((data->set).field_0x8bd & 0x10) != 0) {
              Curl_infof(data,"Ignore %ld bytes of response-body");
            }
            goto LAB_0058339a;
          }
        }
LAB_00583707:
        ts->keepon = KEEPON_DONE;
        goto LAB_0058339a;
      }
LAB_005839c1:
      local_94 = CVar6;
      bVar13 = false;
      goto LAB_005839c4;
    }
    goto LAB_00583b6c;
  }
LAB_00583019:
  CVar6 = CURLE_RECV_ERROR;
LAB_00583c7b:
  *done = false;
  return CVar6;
LAB_0058394c:
  ts->keepon = KEEPON_DONE;
LAB_00583954:
  local_96 = true;
  bVar13 = true;
  if (99 < (data->info).httpproxycode - 200U) {
    local_94 = Curl_http_auth_act(data);
LAB_0058399c:
    bVar13 = true;
  }
LAB_005839c4:
  iVar7 = Curl_pgrsUpdate(data);
  ts = local_88;
  if (iVar7 == 0) {
    CVar6 = local_94;
    if (local_94 == CURLE_OK) {
      if (!bVar13) goto LAB_00583b6c;
      h1_tunnel_go_state(cf,local_88,H1_TUNNEL_RESPONSE,data);
switchD_00583152_caseD_3:
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
         (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"CONNECT response");
      }
      if ((data->req).newurl == (char *)0x0) goto LAB_00583aaf;
      if (((ts->field_0x11c & 2) == 0) && (((uint)local_70->bits & 0x40) == 0)) {
        h1_tunnel_go_state(cf,ts,H1_TUNNEL_INIT,data);
switchD_00583152_default:
        if ((data->req).newurl == (char *)0x0) goto LAB_00583aaf;
        goto LAB_0058311d;
      }
      if ((((data->set).field_0x8bd & 0x10) != 0) &&
         ((cf->cft->log_level < 1 ||
          (Curl_trc_cf_infof(data,cf,"CONNECT need to close+open"),
          ((data->set).field_0x8bd & 0x10) != 0)))) {
        Curl_infof(data,"Connect me again please");
      }
      Curl_conn_cf_close(cf,data);
      Curl_conncontrol(local_70,0);
      CVar6 = Curl_conn_cf_connect(cf->next,data,false,&local_96);
      if (CVar6 == CURLE_OK) goto LAB_00583b6c;
    }
  }
  else {
    CVar6 = CURLE_ABORTED_BY_CALLBACK;
  }
LAB_00583c64:
  h1_tunnel_go_state(cf,local_88,H1_TUNNEL_FAILED,data);
  goto LAB_00583c7b;
LAB_00583aaf:
  if ((data->info).httpproxycode - 200U < 100) {
    h1_tunnel_go_state(cf,ts,H1_TUNNEL_ESTABLISHED,data);
    if (((data->set).field_0x8bd & 0x10) != 0) {
      Curl_infof(data,"CONNECT tunnel established, response %d",
                 (ulong)(uint)(data->info).httpproxycode);
    }
LAB_00583b6c:
    (*Curl_cfree)((data->state).aptr.proxyuserpwd);
    (data->state).aptr.proxyuserpwd = (char *)0x0;
    if (cf->ctx == (void *)0x0) {
      *done = false;
      return CURLE_OK;
    }
    bVar13 = *(int *)((long)cf->ctx + 0x118) == 4;
    *done = bVar13;
    if (!bVar13) {
      return CURLE_OK;
    }
    cf->field_0x24 = cf->field_0x24 | 1;
    (data->req).bytecount = 0;
    *(ushort *)&(data->req).field_0xbb = (*(ushort *)&(data->req).field_0xbb & 0xffde) + 1;
    Curl_client_cleanup(data);
    Curl_pgrsSetUploadCounter(data,0);
    Curl_pgrsSetDownloadCounter(data,0);
    tunnel_free(cf,data);
    return CURLE_OK;
  }
  (*Curl_cfree)((void *)0x0);
  (data->req).newurl = (char *)0x0;
  Curl_conncontrol(local_70,2);
  h1_tunnel_go_state(cf,ts,H1_TUNNEL_FAILED,data);
  Curl_failf(data,"CONNECT tunnel failed, response %d",(ulong)(uint)(data->req).httpcode);
  goto LAB_00583019;
}

Assistant:

static CURLcode cf_h1_proxy_connect(struct Curl_cfilter *cf,
                                    struct Curl_easy *data,
                                    bool blocking, bool *done)
{
  CURLcode result;
  struct h1_tunnel_state *ts = cf->ctx;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  CURL_TRC_CF(data, cf, "connect");
  result = cf->next->cft->do_connect(cf->next, data, blocking, done);
  if(result || !*done)
    return result;

  *done = FALSE;
  if(!ts) {
    result = tunnel_init(cf, data, &ts);
    if(result)
      return result;
    cf->ctx = ts;
  }

  /* TODO: can we do blocking? */
  /* We want "seamless" operations through HTTP proxy tunnel */

  result = H1_CONNECT(cf, data, ts);
  if(result)
    goto out;
  Curl_safefree(data->state.aptr.proxyuserpwd);

out:
  *done = (result == CURLE_OK) && tunnel_is_established(cf->ctx);
  if(*done) {
    cf->connected = TRUE;
    /* Restore `data->req` fields that may habe been touched */
    data->req.header = TRUE; /* assume header */
    data->req.bytecount = 0;
    data->req.ignorebody = FALSE;
    Curl_client_cleanup(data);
    Curl_pgrsSetUploadCounter(data, 0);
    Curl_pgrsSetDownloadCounter(data, 0);

    tunnel_free(cf, data);
  }
  return result;
}